

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O2

void __thiscall
adios2::helper::CommImplMPI::Bcast
          (CommImplMPI *this,void *buffer,size_t count,Datatype datatype,int root,string *hint)

{
  int value;
  long lVar1;
  size_t sVar2;
  
  sVar2 = 0x40000000;
  if (count < 0x40000000) {
    sVar2 = count;
  }
  while (count != 0) {
    value = MPI_Bcast(buffer,sVar2 & 0xffffffff,
                      *(undefined8 *)
                       ((anonymous_namespace)::DatatypeToMPI + (long)(int)datatype * 8),root,
                      this->m_MPIComm);
    anon_unknown_1::CheckMPIReturn(value,hint);
    lVar1 = adios2::helper::CommImpl::SizeOf(datatype);
    buffer = (void *)((long)buffer + lVar1 * sVar2);
    count = count - sVar2;
    sVar2 = 0x40000000;
    if (count < 0x40000000) {
      sVar2 = count;
    }
  }
  return;
}

Assistant:

void CommImplMPI::Bcast(void *buffer, size_t count, Datatype datatype, int root,
                        const std::string &hint) const
{
    size_t inputSize = count;
    const int MAXBCASTSIZE = 1073741824;
    size_t blockSize = (inputSize > MAXBCASTSIZE ? MAXBCASTSIZE : inputSize);
    unsigned char *blockBuf = static_cast<unsigned char *>(buffer);
    while (inputSize > 0)
    {
        CheckMPIReturn(
            MPI_Bcast(blockBuf, static_cast<int>(blockSize), ToMPI(datatype), root, m_MPIComm),
            hint);
        blockBuf += blockSize * CommImpl::SizeOf(datatype);
        inputSize -= blockSize;
        blockSize = (inputSize > MAXBCASTSIZE ? MAXBCASTSIZE : inputSize);
    }
}